

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O0

ssize_t chatter::platform::SocketSendTo(Socket socket,void *buf,size_t buf_len,HostAddress *address)

{
  uint16_t host;
  ssize_t sVar1;
  undefined1 local_38 [8];
  sockaddr_in dest;
  HostAddress *address_local;
  size_t buf_len_local;
  void *buf_local;
  Socket socket_local;
  
  dest.sin_zero = (uchar  [8])address;
  memset(local_38,0,0x10);
  local_38._0_2_ = 2;
  host = HostAddress::port((HostAddress *)dest.sin_zero);
  local_38._2_2_ = HostToNet16(host);
  local_38._4_4_ = HostAddress::address((HostAddress *)dest.sin_zero);
  sVar1 = sendto(socket,buf,buf_len,0,(sockaddr *)local_38,0x10);
  return sVar1;
}

Assistant:

ssize_t SocketSendTo(Socket socket, const void *buf, size_t buf_len, const HostAddress& address)
{
    struct sockaddr_in dest = {0};
    dest.sin_family = AF_INET;
    dest.sin_port = HostToNet16(address.port());
    dest.sin_addr.s_addr = address.address();
    return sendto((int)socket, buf, buf_len, 0, (struct sockaddr*)&dest, sizeof(dest));
}